

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::SetCurrentSourceDirectory(cmMakefile *this,string *dir)

{
  char *value;
  allocator local_39;
  string local_38;
  string *local_18;
  string *dir_local;
  cmMakefile *this_local;
  
  local_18 = dir;
  dir_local = (string *)this;
  cmState::Snapshot::SetCurrentSourceDirectory(&this->StateSnapshot,dir);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"CMAKE_CURRENT_SOURCE_DIR",&local_39);
  value = cmState::Snapshot::GetCurrentSourceDirectory(&this->StateSnapshot);
  AddDefinition(this,&local_38,value);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void cmMakefile::SetCurrentSourceDirectory(const std::string& dir)
{
  this->StateSnapshot.SetCurrentSourceDirectory(dir);
  this->AddDefinition("CMAKE_CURRENT_SOURCE_DIR",
                      this->StateSnapshot.GetCurrentSourceDirectory());
}